

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

int Curl_closesocket(connectdata *conn,curl_socket_t sock)

{
  int iVar1;
  curl_socket_t sock_local;
  connectdata *conn_local;
  
  if ((conn != (connectdata *)0x0) && (conn->fclosesocket != (curl_closesocket_callback)0x0)) {
    if ((sock != conn->sock[1]) || ((conn->sock_accepted[1] & 1U) == 0)) {
      iVar1 = (*conn->fclosesocket)(conn->closesocket_client,sock);
      return iVar1;
    }
    conn->sock_accepted[1] = false;
  }
  close(sock);
  if (conn != (connectdata *)0x0) {
    Curl_multi_closed(conn,sock);
  }
  return 0;
}

Assistant:

int Curl_closesocket(struct connectdata *conn,
                      curl_socket_t sock)
{
  if(conn && conn->fclosesocket) {
    if((sock == conn->sock[SECONDARYSOCKET]) &&
       conn->sock_accepted[SECONDARYSOCKET])
      /* if this socket matches the second socket, and that was created with
         accept, then we MUST NOT call the callback but clear the accepted
         status */
      conn->sock_accepted[SECONDARYSOCKET] = FALSE;
    else
      return conn->fclosesocket(conn->closesocket_client, sock);
  }
  sclose(sock);

  if(conn)
    /* tell the multi-socket code about this */
    Curl_multi_closed(conn, sock);

  return 0;
}